

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O2

uint64 ecx_readeepromFP(ecx_contextt *context,uint16 configadr,uint16 eeproma,int timeout)

{
  uint16 uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  uint16 estat;
  uint32 edat32;
  ec_eepromt ed;
  uint64 local_38;
  
  local_38 = 0;
  edat32 = 0;
  uVar1 = ecx_eeprom_waitnotbusyFP(context,configadr,&estat,timeout);
  if (uVar1 != 0) {
    if ((estat & 0x7800) != 0) {
      estat = 0;
      ecx_FPWR(context->port,configadr,0x502,2,&estat,6000);
    }
    iVar4 = 0;
    do {
      ed.comm = 0x100;
      ed.d2 = 0;
      uVar3 = 0;
      ed.addr = eeproma;
      do {
        iVar2 = ecx_FPWR(context->port,configadr,0x502,6,&ed,2000);
        if (0 < iVar2) break;
        bVar5 = uVar3 < 3;
        uVar3 = uVar3 + 1;
      } while (bVar5);
      if (iVar2 != 0) {
        osal_usleep(200);
        estat = 0;
        uVar1 = ecx_eeprom_waitnotbusyFP(context,configadr,&estat,timeout);
        if (uVar1 != 0) {
          if ((estat >> 0xd & 1) == 0) {
            if ((estat & 0x40) != 0) {
              uVar3 = 0;
              do {
                iVar4 = ecx_FPRD(context->port,configadr,0x508,8,&local_38,2000);
                if (0 < iVar4) {
                  return local_38;
                }
                bVar5 = uVar3 < 3;
                uVar3 = uVar3 + 1;
              } while (bVar5);
              return local_38;
            }
            uVar3 = 0;
            goto LAB_00109f10;
          }
          iVar4 = iVar4 + 1;
          osal_usleep(1000);
        }
      }
    } while (iVar4 - 1U < 2);
  }
  return 0;
  while (bVar5 = uVar3 < 3, uVar3 = uVar3 + 1, bVar5) {
LAB_00109f10:
    iVar4 = ecx_FPRD(context->port,configadr,0x508,4,&edat32,2000);
    if (0 < iVar4) break;
  }
  return (ulong)edat32;
}

Assistant:

uint64 ecx_readeepromFP(ecx_contextt *context, uint16 configadr, uint16 eeproma, int timeout)
{
   uint16 estat;
   uint32 edat32;
   uint64 edat64;
   ec_eepromt ed;
   int wkc, cnt, nackcnt = 0;

   edat64 = 0;
   edat32 = 0;
   if (ecx_eeprom_waitnotbusyFP(context, configadr, &estat, timeout))
   {
      if (estat & EC_ESTAT_EMASK) /* error bits are set */
      {
         estat = htoes(EC_ECMD_NOP); /* clear error bits */
         wkc=ecx_FPWR(context->port, configadr, ECT_REG_EEPCTL, sizeof(estat), &estat, EC_TIMEOUTRET3);
      }

      do
      {
         ed.comm = htoes(EC_ECMD_READ);
         ed.addr = htoes(eeproma);
         ed.d2   = 0x0000;
         cnt = 0;
         do
         {
            wkc=ecx_FPWR(context->port, configadr, ECT_REG_EEPCTL, sizeof(ed), &ed, EC_TIMEOUTRET);
         }
         while ((wkc <= 0) && (cnt++ < EC_DEFAULTRETRIES));
         if (wkc)
         {
            osal_usleep(EC_LOCALDELAY);
            estat = 0x0000;
            if (ecx_eeprom_waitnotbusyFP(context, configadr, &estat, timeout))
            {
               if (estat & EC_ESTAT_NACK)
               {
                  nackcnt++;
                  osal_usleep(EC_LOCALDELAY * 5);
               }
               else
               {
                  nackcnt = 0;
                  if (estat & EC_ESTAT_R64)
                  {
                     cnt = 0;
                     do
                     {
                        wkc=ecx_FPRD(context->port, configadr, ECT_REG_EEPDAT, sizeof(edat64), &edat64, EC_TIMEOUTRET);
                     }
                     while ((wkc <= 0) && (cnt++ < EC_DEFAULTRETRIES));
                  }
                  else
                  {
                     cnt = 0;
                     do
                     {
                        wkc=ecx_FPRD(context->port, configadr, ECT_REG_EEPDAT, sizeof(edat32), &edat32, EC_TIMEOUTRET);
                     }
                     while ((wkc <= 0) && (cnt++ < EC_DEFAULTRETRIES));
                     edat64=(uint64)edat32;
                  }
               }
            }
         }
      }
      while ((nackcnt > 0) && (nackcnt < 3));
   }

   return edat64;
}